

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O1

void __thiscall Image::EmplaceData(Image *this,string *filename)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  int *piVar4;
  size_type __new_size;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  RgbaInputFile in;
  Rgba local_68 [7];
  
  pcVar2 = (filename->_M_dataplus)._M_p;
  iVar3 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_68,pcVar2,iVar3);
  piVar4 = (int *)Imf_2_5::RgbaInputFile::dataWindow();
  iVar3 = *piVar4;
  iVar1 = piVar4[1];
  uVar7 = ((long)piVar4[2] - (long)iVar3) + 1;
  uVar5 = (piVar4[3] - iVar1) + 1;
  iVar6 = (int)uVar7;
  printf("Loaded EXR \"%s\", image has %dx%d \n",pcVar2,uVar7 & 0xffffffff,(ulong)uVar5);
  __new_size = (size_type)(int)(uVar5 * iVar6);
  if ((long)(this->m_Data).super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>._M_impl
            .super__Vector_impl_data._M_finish -
      (long)(this->m_Data).super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>._M_impl
            .super__Vector_impl_data._M_start >> 3 != __new_size) {
    printf("Allocating buffer for %ld pixels\n",__new_size);
    std::vector<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>::resize(&this->m_Data,__new_size);
  }
  Imf_2_5::RgbaInputFile::setFrameBuffer
            (local_68,(ulong)((this->m_Data).
                              super__Vector_base<Imf_2_5::Rgba,_std::allocator<Imf_2_5::Rgba>_>.
                              _M_impl.super__Vector_impl_data._M_start +
                             (-(long)iVar3 - (long)(iVar6 * iVar1))),1);
  Imf_2_5::RgbaInputFile::readPixels((int)local_68,iVar1);
  (this->m_Size).x = iVar6;
  (this->m_Size).y = uVar5;
  Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_68);
  return;
}

Assistant:

void Image::EmplaceData(const std::string &filename) {

    auto fn = filename.c_str();

    try {

        Imf::RgbaInputFile in(fn);

        Imath::Box2i win = in.dataWindow();

        Imath::V2i dim(win.max.x - win.min.x + 1, win.max.y - win.min.y + 1);

        parallel_printf("Loaded EXR \"%s\", image has %dx%d \n", fn, dim.x,
                        dim.y);

        size_t datalen = dim.x * dim.y;

        {
        if (m_Data.size() != datalen) {
            parallel_printf("Allocating buffer for %ld pixels\n", datalen);
            m_Data.resize(datalen);
        }
        }

        int dx = win.min.x;
        int dy = win.min.y;

        in.setFrameBuffer(m_Data.data() - dx - dy * dim.x, 1, dim.x);
        in.readPixels(win.min.y, win.max.y);
        m_Size = dim;

    } catch (Iex::BaseExc &e) {
        parallel_printf("Error loading EXR from \"%s\" err=%s \n", fn,
                        e.what());
        throw;
    }
}